

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeObjectPrototype
               (DynamicObject *objectPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Type *pTVar2;
  RuntimeFunction **ppRVar3;
  JavascriptFunction *pJVar4;
  JavascriptMethod entryPoint;
  JavascriptFunction **ppJVar5;
  DynamicType *pDVar6;
  DynamicTypeHandler *pDVar7;
  JavascriptFunction *pJVar8;
  bool hadOnlyWritableDataProperties;
  Type *builtinFuncs;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *objectPrototype_local;
  
  this = RecyclableObject::GetLibrary(&objectPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&objectPrototype->super_RecyclableObject);
  pTVar2 = GetBuiltinFunctions(this);
  DeferredTypeHandlerBase::Convert(typeHandler,objectPrototype,mode,0xb,1);
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectConstructor);
  AddMember(this,objectPrototype,0x67,*ppRVar3);
  pJVar4 = AddFunctionToLibraryObject
                     (this,objectPrototype,0xb7,
                      (FunctionInfo *)JavascriptObject::EntryInfo::HasOwnProperty,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(pTVar2 + 0x45,pJVar4);
  AddFunctionToLibraryObject
            (this,objectPrototype,0x123,
             (FunctionInfo *)JavascriptObject::EntryInfo::PropertyIsEnumerable,1,'\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0xc5,(FunctionInfo *)JavascriptObject::EntryInfo::IsPrototypeOf,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0x172,(FunctionInfo *)JavascriptObject::EntryInfo::ToLocaleString,
             0,'\x06');
  pJVar4 = AddFunctionToLibraryObject
                     (this,objectPrototype,0x178,
                      (FunctionInfo *)JavascriptObject::EntryInfo::ToString,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(&this->objectToStringFunction,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this,objectPrototype,0x18e,
                      (FunctionInfo *)JavascriptObject::EntryInfo::ValueOf,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(&this->objectValueOfFunction,pJVar4);
  entryPoint = FunctionInfo::GetOriginalEntryPoint
                         ((FunctionInfo *)JavascriptObject::EntryInfo::ToString);
  ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->objectToStringFunction);
  ScriptContext::SetBuiltInLibraryFunction(this_00,entryPoint,*ppJVar5);
  pDVar6 = DynamicObject::GetDynamicType(objectPrototype);
  pDVar7 = DynamicType::GetTypeHandler(pDVar6);
  bVar1 = DynamicTypeHandler::GetHasOnlyWritableDataProperties(pDVar7);
  pJVar4 = Get__proto__getterFunction(this);
  pJVar8 = Get__proto__setterFunction(this);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(objectPrototype,0x1eb,pJVar4,pJVar8,0x40);
  (*(objectPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3d])(objectPrototype,0x1eb,0);
  if (bVar1) {
    pDVar6 = DynamicObject::GetDynamicType(objectPrototype);
    pDVar7 = DynamicType::GetTypeHandler(pDVar6);
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(pDVar7);
  }
  AddFunctionToLibraryObject
            (this,objectPrototype,0x1e7,(FunctionInfo *)JavascriptObject::EntryInfo::DefineGetter,2,
             '\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0x1e8,(FunctionInfo *)JavascriptObject::EntryInfo::DefineSetter,2,
             '\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0x1e9,(FunctionInfo *)JavascriptObject::EntryInfo::LookupGetter,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,objectPrototype,0x1ea,(FunctionInfo *)JavascriptObject::EntryInfo::LookupSetter,1,
             '\x06');
  DynamicObject::SetHasNoEnumerableProperties(objectPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeObjectPrototype(DynamicObject* objectPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = objectPrototype->GetLibrary();
        ScriptContext* scriptContext = objectPrototype->GetScriptContext();
        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        typeHandler->Convert(objectPrototype, mode, 11, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterObject
        // so that the update is in sync with profiler
        library->AddMember(objectPrototype, PropertyIds::constructor, library->objectConstructor);
        builtinFuncs[BuiltinFunction::JavascriptObject_HasOwnProperty] = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::hasOwnProperty, &JavascriptObject::EntryInfo::HasOwnProperty, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::propertyIsEnumerable, &JavascriptObject::EntryInfo::PropertyIsEnumerable, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::isPrototypeOf, &JavascriptObject::EntryInfo::IsPrototypeOf, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::toLocaleString, &JavascriptObject::EntryInfo::ToLocaleString, 0);

        library->objectToStringFunction = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::toString, &JavascriptObject::EntryInfo::ToString, 0);
        library->objectValueOfFunction = library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::valueOf, &JavascriptObject::EntryInfo::ValueOf, 0);

        scriptContext->SetBuiltInLibraryFunction(JavascriptObject::EntryInfo::ToString.GetOriginalEntryPoint(), library->objectToStringFunction);

        bool hadOnlyWritableDataProperties = objectPrototype->GetDynamicType()->GetTypeHandler()->GetHasOnlyWritableDataProperties();
        objectPrototype->SetAccessors(PropertyIds::__proto__, library->Get__proto__getterFunction(), library->Get__proto__setterFunction(), PropertyOperation_NonFixedValue);
        objectPrototype->SetEnumerable(PropertyIds::__proto__, FALSE);
        // Let's pretend __proto__ is actually writable.  We'll make sure we always go through a special code path when writing to it.
        if (hadOnlyWritableDataProperties)
        {
            objectPrototype->GetDynamicType()->GetTypeHandler()->SetHasOnlyWritableDataProperties();
        }

        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__defineGetter__, &JavascriptObject::EntryInfo::DefineGetter, 2);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__defineSetter__, &JavascriptObject::EntryInfo::DefineSetter, 2);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__lookupGetter__, &JavascriptObject::EntryInfo::LookupGetter, 1);
        library->AddFunctionToLibraryObject(objectPrototype, PropertyIds::__lookupSetter__, &JavascriptObject::EntryInfo::LookupSetter, 1);

        objectPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }